

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__7,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *pcVar1;
  EnumDescriptor *pEVar2;
  undefined8 *puVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_60;
  char *local_58;
  ulong local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  
  pEVar2 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  pcVar1 = (pEVar2->all_names_).payload_;
  local_50 = (ulong)*(ushort *)(pcVar1 + 2);
  puVar3 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 0x30) & 0xfffffffffffffffc);
  local_28 = *puVar3;
  local_30 = puVar3[1];
  local_60 = 0xb;
  local_58 = "Enum type \"";
  pieces._M_len = pcVar1 + ~local_50;
  local_40 = 0x16;
  local_38 = "\" has no value named \"";
  local_20 = 2;
  local_18 = "\".";
  pieces._M_array = (iterator)0x5;
  local_48 = pieces._M_len;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_60,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}